

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
duckdb::Connection::CreateScalarFunction<duckdb::string_t,duckdb::string_t>
          (Connection *this,string *name,vector<duckdb::LogicalType,_true> *args,
          LogicalType *ret_type,_func_string_t_string_t *udf_func)

{
  pointer pcVar1;
  type pCVar2;
  _func_string_t_string_t *in_R9;
  scalar_function_t function;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  LogicalType local_90 [24];
  LogicalType local_78 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  UDFWrapper::CreateScalarFunction<duckdb::string_t,duckdb::string_t>
            ((scalar_function_t *)&local_b0,(UDFWrapper *)name,(string *)args,
             (vector<duckdb::LogicalType,_true> *)ret_type,(LogicalType *)udf_func,in_R9);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + name->_M_string_length);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  duckdb::LogicalType::LogicalType(local_78,ret_type);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_d0,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_b0);
  pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(local_90,INVALID);
  duckdb::UDFWrapper::RegisterFunction(local_48,&local_60,local_78,&local_d0,pCVar2,local_90);
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  duckdb::LogicalType::~LogicalType(local_78);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  return;
}

Assistant:

void CreateScalarFunction(const string &name, vector<LogicalType> args, LogicalType ret_type,
	                          TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		UDFWrapper::RegisterFunction(name, args, ret_type, function, *context);
	}